

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.cpp
# Opt level: O0

Vector3f pbrt::EqualAreaSquareToSphere(Point2f p)

{
  undefined8 uVar1;
  float fVar2;
  Tuple3<pbrt::Vector3,_float> TVar3;
  int in_EDI;
  float fVar4;
  float fVar5;
  float fVar6;
  double dVar7;
  double dVar8;
  undefined1 in_ZMM0 [64];
  LogLevel unaff_retaddr;
  Float sinPhi;
  Float cosPhi;
  Float z;
  Float phi;
  Float r;
  Float d;
  Float signedDistance;
  Float vp;
  Float up;
  Float v;
  Float u;
  float in_stack_ffffffffffffff98;
  undefined4 uVar9;
  undefined4 local_54;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  float fVar10;
  undefined4 in_stack_ffffffffffffffe8;
  float fVar11;
  undefined4 uStack_10;
  int in_stack_fffffffffffffff4;
  undefined4 in_stack_fffffffffffffff8;
  float in_stack_fffffffffffffffc;
  
  uVar1 = vmovlpd_avx(in_ZMM0._0_16_);
  fVar4 = (float)uVar1;
  uStack_10 = (float)((ulong)uVar1 >> 0x20);
  if ((((0.0 <= fVar4) && (fVar4 <= 1.0)) && (0.0 <= uStack_10)) && (uStack_10 <= 1.0)) {
    fVar4 = fVar4 * 2.0 - 1.0;
    fVar6 = uStack_10 * 2.0 - 1.0;
    fVar11 = fVar4;
    std::abs(in_EDI);
    fVar10 = fVar6;
    std::abs(in_EDI);
    fVar2 = 1.0 - (fVar4 + fVar6);
    fVar5 = fVar2;
    std::abs(in_EDI);
    fVar5 = 1.0 - fVar5;
    if ((fVar5 != 0.0) || (NAN(fVar5))) {
      local_54 = (fVar6 - fVar4) / fVar5 + 1.0;
    }
    else {
      local_54 = 1.0;
    }
    fVar4 = local_54 * 3.1415927 * 0.25;
    fVar6 = Sqr<float>(fVar5);
    pstd::copysign((double)(ulong)(uint)(1.0 - fVar6),(double)(ulong)(uint)fVar2);
    dVar7 = std::cos((double)(ulong)(uint)fVar4);
    dVar7 = pstd::copysign(dVar7,(double)(ulong)(uint)fVar11);
    dVar8 = std::sin((double)(ulong)(uint)fVar4);
    dVar8 = pstd::copysign(dVar8,(double)(ulong)(uint)fVar10);
    fVar4 = SUB84(dVar7,0) * fVar5;
    Sqr<float>(fVar5);
    uVar9 = 0x40000000;
    SafeSqrt(0.0);
    fVar6 = SUB84(dVar8,0) * fVar5;
    Sqr<float>(fVar5);
    SafeSqrt(0.0);
    Vector3<float>::Vector3
              ((Vector3<float> *)CONCAT44(fVar6,uVar9),fVar4,in_stack_ffffffffffffff98,0.0);
    TVar3.y = (float)in_stack_fffffffffffffff8;
    TVar3.x = (float)in_stack_fffffffffffffff4;
    TVar3.z = in_stack_fffffffffffffffc;
    return (Vector3f)TVar3;
  }
  LogFatal<char_const(&)[45]>
            (unaff_retaddr,(char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
             in_stack_fffffffffffffff4,(char *)CONCAT44(fVar4,in_stack_ffffffffffffffe8),
             (char (*) [45])CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
}

Assistant:

PBRT_CPU_GPU Vector3f EqualAreaSquareToSphere(Point2f p) {
    CHECK(p.x >= 0 && p.x <= 1 && p.y >= 0 && p.y <= 1);
    // Transform _p_ to $[-1,1]^2$ and compute absolute values
    Float u = 2 * p.x - 1, v = 2 * p.y - 1;
    Float up = std::abs(u), vp = std::abs(v);

    // Compute radius _r_ as signed distance from diagonal
    Float signedDistance = 1 - (up + vp);
    Float d = std::abs(signedDistance);
    Float r = 1 - d;

    // Compute angle $\phi$ for square to sphere mapping
    Float phi = (r == 0 ? 1 : (vp - up) / r + 1) * Pi / 4;

    // Find $z$ coordinate for spherical direction
    Float z = pstd::copysign(1 - Sqr(r), signedDistance);

    // Compute $\cos\phi$ and $\sin\phi$ for original quadrant and return vector
    Float cosPhi = pstd::copysign(std::cos(phi), u);
    Float sinPhi = pstd::copysign(std::sin(phi), v);
    return Vector3f(cosPhi * r * SafeSqrt(2 - Sqr(r)), sinPhi * r * SafeSqrt(2 - Sqr(r)),
                    z);
}